

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

void __thiscall xLearn::InmemReader::init_from_binary(InmemReader *this)

{
  size_type sVar1;
  reference pvVar2;
  size_type in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  int i;
  bool in_stack_000000c7;
  size_t in_stack_000000c8;
  DMatrix *in_stack_000000d0;
  string *in_stack_00000198;
  DMatrix *in_stack_000001a0;
  undefined4 local_c;
  
  sVar1 = in_RDI;
  DMatrix::Deserialize(in_stack_000001a0,in_stack_00000198);
  *(byte *)(in_RDI + 0x98) = *(byte *)(in_RDI + 0x138) & 1;
  *(undefined4 *)(in_RDI + 0x140) = *(undefined4 *)(in_RDI + 0xe8);
  DMatrix::ReAlloc(in_stack_000000d0,in_stack_000000c8,in_stack_000000c7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(unaff_retaddr,sVar1);
  local_c = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x148));
    if (sVar1 <= (ulong)(long)(int)local_c) break;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x148),
                        (long)(int)local_c);
    *pvVar2 = local_c;
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void InmemReader::init_from_binary() {
  // Init data_buf_                               
  data_buf_.Deserialize(filename_);
  has_label_ = data_buf_.has_label;
  // Init data_samples_
  num_samples_ = data_buf_.row_length;
  data_samples_.ReAlloc(num_samples_);
  // for shuffle
  order_.resize(num_samples_);
  for (int i = 0; i < order_.size(); ++i) {
    order_[i] = i;
  }
}